

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

bool __thiscall MockSupport::wasLastActualCallFulfilled(MockSupport *this)

{
  bool bVar1;
  uint uVar2;
  MockSupport *pMVar3;
  MockNamedValueListNode *local_20;
  MockNamedValueListNode *p;
  MockSupport *this_local;
  
  if ((this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) &&
     (uVar2 = (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x2f])(),
     (uVar2 & 1) == 0)) {
    return false;
  }
  local_20 = MockNamedValueList::begin(&this->data_);
  do {
    if (local_20 == (MockNamedValueListNode *)0x0) {
      return true;
    }
    pMVar3 = getMockSupport(this,local_20);
    if (pMVar3 != (MockSupport *)0x0) {
      pMVar3 = getMockSupport(this,local_20);
      bVar1 = wasLastActualCallFulfilled(pMVar3);
      if (!bVar1) {
        return false;
      }
    }
    local_20 = MockNamedValueListNode::next(local_20);
  } while( true );
}

Assistant:

bool MockSupport::wasLastActualCallFulfilled()
{
    if (lastActualFunctionCall_ && !lastActualFunctionCall_->isFulfilled())
        return false;

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p) && !getMockSupport(p)->wasLastActualCallFulfilled())
                return false;

    return true;
}